

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient2dslow(double *pa,double *pb,double *pc)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double _2;
  double _1;
  double _0;
  double _n;
  double _m;
  double _l;
  double _k;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double a1lo;
  double a1hi;
  double a0lo;
  double a0hi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  int deterlen;
  double deter [16];
  double bxay7;
  double axby7;
  double bxay [8];
  double axby [8];
  double negatetail;
  double negate;
  double bcytail;
  double bcxtail;
  double acytail;
  double acxtail;
  double bcy;
  double bcx;
  double acy;
  double acx;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar2 = *pa - (*pa - *pc);
  dVar2 = (*pa - ((*pa - *pc) + dVar2)) + (dVar2 - *pc);
  dVar3 = pa[1] - pc[1];
  dVar4 = *pb - *pc;
  dVar5 = (*pb - (dVar4 + (*pb - dVar4))) + ((*pb - dVar4) - *pc);
  dVar6 = pb[1] - (pb[1] - pc[1]);
  dVar6 = (pb[1] - ((pb[1] - pc[1]) + dVar6)) + (dVar6 - pc[1]);
  dVar7 = splitter * dVar2 - (splitter * dVar2 - dVar2);
  dVar8 = splitter * dVar6 - (splitter * dVar6 - dVar6);
  bxay[7] = (dVar2 - dVar7) * (dVar6 - dVar8) +
            -(-dVar7 * (dVar6 - dVar8) + -(dVar2 - dVar7) * dVar8 + -dVar7 * dVar8 + dVar2 * dVar6);
  dVar2 = -dVar3;
  dVar3 = -((pa[1] - (dVar3 + (pa[1] - dVar3))) + ((pa[1] - dVar3) - pc[1]));
  dVar6 = splitter * dVar5 - (splitter * dVar5 - dVar5);
  dVar7 = dVar5 - dVar6;
  dVar8 = splitter * dVar3 - (splitter * dVar3 - dVar3);
  dVar9 = dVar3 - dVar8;
  dVar10 = dVar5 * dVar3;
  axby7 = dVar7 * dVar9 + -(-dVar6 * dVar9 + -dVar7 * dVar8 + -dVar6 * dVar8 + dVar10);
  dVar11 = splitter * dVar4 - (splitter * dVar4 - dVar4);
  dVar12 = dVar4 - dVar11;
  dVar3 = dVar4 * dVar3;
  dVar8 = dVar12 * dVar9 + -(-dVar11 * dVar9 + -dVar12 * dVar8 + -dVar11 * dVar8 + dVar3);
  dVar13 = dVar10 + dVar8;
  dVar8 = (dVar10 - (dVar13 - (dVar13 - dVar10))) + (dVar8 - (dVar13 - dVar10));
  dVar9 = dVar3 + dVar13;
  dVar13 = dVar13 - (dVar9 - dVar3);
  dVar3 = splitter * dVar2 - (splitter * dVar2 - dVar2);
  dVar10 = dVar2 - dVar3;
  dVar5 = dVar5 * dVar2;
  dVar6 = dVar7 * dVar10 + -(-dVar6 * dVar10 + -dVar7 * dVar3 + -dVar6 * dVar3 + dVar5);
  dVar7 = dVar8 + dVar6;
  bxay[0] = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar6 - (dVar7 - dVar8));
  dVar6 = dVar13 + dVar7;
  dVar7 = (dVar13 - (dVar6 - (dVar6 - dVar13))) + (dVar7 - (dVar6 - dVar13));
  dVar8 = dVar9 + dVar6;
  dVar6 = (dVar9 - (dVar8 - (dVar8 - dVar9))) + (dVar6 - (dVar8 - dVar9));
  dVar4 = dVar4 * dVar2;
  dVar2 = dVar12 * dVar10 + -(-dVar11 * dVar10 + -dVar12 * dVar3 + -dVar11 * dVar3 + dVar4);
  dVar3 = dVar5 + dVar2;
  dVar2 = (dVar5 - (dVar3 - (dVar3 - dVar5))) + (dVar2 - (dVar3 - dVar5));
  dVar9 = dVar7 + dVar2;
  bxay[1] = (dVar7 - (dVar9 - (dVar9 - dVar7))) + (dVar2 - (dVar9 - dVar7));
  dVar2 = dVar6 + dVar9;
  dVar6 = (dVar6 - (dVar2 - (dVar2 - dVar6))) + (dVar9 - (dVar2 - dVar6));
  dVar7 = dVar8 + dVar2;
  dVar2 = (dVar8 - (dVar7 - (dVar7 - dVar8))) + (dVar2 - (dVar7 - dVar8));
  dVar8 = dVar4 + dVar3;
  dVar3 = (dVar4 - (dVar8 - (dVar8 - dVar4))) + (dVar3 - (dVar8 - dVar4));
  dVar9 = dVar6 + dVar3;
  bxay[2] = (dVar6 - (dVar9 - (dVar9 - dVar6))) + (dVar3 - (dVar9 - dVar6));
  dVar3 = dVar2 + dVar9;
  dVar2 = (dVar2 - (dVar3 - (dVar3 - dVar2))) + (dVar9 - (dVar3 - dVar2));
  dVar6 = dVar7 + dVar3;
  dVar3 = (dVar7 - (dVar6 - (dVar6 - dVar7))) + (dVar3 - (dVar6 - dVar7));
  dVar7 = dVar2 + dVar8;
  bxay[3] = (dVar2 - (dVar7 - (dVar7 - dVar2))) + (dVar8 - (dVar7 - dVar2));
  dVar2 = dVar3 + dVar7;
  bxay[4] = (dVar3 - (dVar2 - (dVar2 - dVar3))) + (dVar7 - (dVar2 - dVar3));
  deter[0xf] = dVar6 + dVar2;
  bxay[5] = (dVar6 - (deter[0xf] - (deter[0xf] - dVar6))) + (dVar2 - (deter[0xf] - dVar6));
  bxay[6] = deter[0xf];
  iVar1 = fast_expansion_sum_zeroelim(8,bxay + 7,8,&axby7,(double *)&stack0xfffffffffffffe78);
  return *(double *)(&stack0xfffffffffffffe78 + (long)(iVar1 + -1) * 8);
}

Assistant:

REAL orient2dslow(REAL *pa, REAL *pb, REAL *pc)
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail;
  REAL bcxtail, bcytail;
  REAL negate, negatetail;
  REAL axby[8], bxay[8];
  INEXACT REAL axby7, bxay7;
  REAL deter[16];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pc[0], acx, acxtail);
  Two_Diff(pa[1], pc[1], acy, acytail);
  Two_Diff(pb[0], pc[0], bcx, bcxtail);
  Two_Diff(pb[1], pc[1], bcy, bcytail);

  Two_Two_Product(acx, acxtail, bcy, bcytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -acy;
  negatetail = -acytail;
  Two_Two_Product(bcx, bcxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;

  deterlen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, deter);

  return deter[deterlen - 1];
}